

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_chk_16_pcix(void)

{
  uint uVar1;
  uint addr_in;
  uint uVar2;
  
  uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  m68ki_address_space = 2;
  addr_in = m68ki_get_ea_ix(m68ki_cpu.pc);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  m68ki_cpu.not_z_flag = uVar1 & 0xffff;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  if ((-1 < (short)uVar1) && ((int)(uVar1 * 0x10000) <= (int)(uVar2 * 0x10000))) {
    return;
  }
  m68ki_cpu.n_flag = (uint)(int)(short)uVar1 >> 0x18 & 0xffffff80;
  m68ki_exception_trap(6);
  return;
}

Assistant:

static void m68k_op_chk_16_pcix(void)
{
	sint src = MAKE_INT_16(DX);
	sint bound = MAKE_INT_16(OPER_PCIX_16());

	FLAG_Z = ZFLAG_16(src); /* Undocumented */
	FLAG_V = VFLAG_CLEAR;   /* Undocumented */
	FLAG_C = CFLAG_CLEAR;   /* Undocumented */

	if(src >= 0 && src <= bound)
	{
		return;
	}
	FLAG_N = (src < 0)<<7;
	m68ki_exception_trap(EXCEPTION_CHK);
}